

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

void __thiscall gfield::reduce<26>(gfield *this,bigint<26> *result)

{
  digit *__dest;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  digit *__src;
  int iVar12;
  undefined1 auStack_64 [4];
  undefined8 uStack_60;
  bigint<13> local_50;
  
  iVar7 = result->len;
  iVar6 = 0xc;
  if (iVar7 < 0xc) {
    iVar6 = iVar7;
  }
  (this->super_gfint).len = iVar6;
  __src = result->digits;
  uStack_60 = 0x15cac5;
  memcpy((this->super_gfint).digits,__src,(long)iVar6 * 2);
  lVar8 = (long)iVar6;
  if (iVar7 != 0) {
    do {
      if ((this->super_gfint).digits[lVar8 + -1] != 0) break;
      lVar10 = lVar8 + -1;
      (this->super_gfint).len = (int)lVar8 + -1;
      lVar8 = lVar10;
    } while (lVar10 != 0);
  }
  iVar7 = result->len;
  if ((long)iVar7 < 0xd) {
    uVar3 = (this->super_gfint).len;
    uVar9 = (ulong)uVar3;
    if (P.super_gfint.len <= (int)uVar3) {
      if ((int)uVar3 <= P.super_gfint.len) {
        do {
          bVar11 = (byte)__src;
          iVar7 = (int)uVar9;
          if (iVar7 < 1) goto LAB_0015cd06;
          uVar1 = (this->super_gfint).digits[uVar9 - 1];
          __src = (digit *)(ulong)uVar1;
          uVar2 = P.super_gfint.digits[uVar9 - 1];
          if (uVar1 < uVar2) {
            bVar11 = 0;
            goto LAB_0015cd06;
          }
          uVar9 = uVar9 - 1;
        } while (uVar1 <= uVar2);
        bVar11 = 1;
LAB_0015cd06:
        if ((0 < iVar7 & (bVar11 ^ 1)) != 0) {
          return;
        }
      }
      bigint<13>::sub<13,13>(&this->super_gfint,&this->super_gfint,&P.super_gfint);
      return;
    }
  }
  else {
    __dest = local_50.digits;
    lVar8 = (long)iVar7 + -0xc;
    iVar12 = (int)lVar8;
    iVar6 = 4;
    if (iVar12 < 4) {
      iVar6 = iVar12;
    }
    uStack_60 = 0x15cb1a;
    memcpy(__dest,result->digits + 0xc,(long)iVar6 * 2);
    if (iVar7 < 0x10) {
      uStack_60 = 0x15cb36;
      memset(__dest + lVar8,0,(ulong)(0x10 - iVar7) * 2);
    }
    local_50.digits[4] = local_50.digits[0];
    local_50.digits[5] = local_50.digits[1];
    local_50.digits[6] = local_50.digits[2];
    local_50.digits[7] = local_50.digits[3];
    uVar5 = local_50.digits._8_8_;
    lVar8 = 8;
    local_50.digits[7] = local_50.digits[3];
    if (local_50.digits[7] == 0) {
      lVar10 = 8;
      do {
        if (lVar10 == 1) {
          lVar8 = 0;
          break;
        }
        lVar8 = lVar10 + -1;
        lVar4 = lVar10 + -2;
        lVar10 = lVar8;
      } while (local_50.digits[lVar4] == 0);
    }
    local_50.len = (int)lVar8;
    uStack_60 = 0x15cbd1;
    local_50.digits._8_8_ = uVar5;
    add<13,13>(this,&this->super_gfint,&local_50);
    iVar7 = result->len;
    if (0x10 < (long)iVar7) {
      local_50.digits[0] = 0;
      local_50.digits[1] = 0;
      local_50.digits[2] = 0;
      local_50.digits[3] = 0;
      iVar6 = 0x14;
      if (iVar7 < 0x14) {
        iVar6 = iVar7;
      }
      uStack_60 = 0x15cc11;
      memcpy(local_50.digits + 4,result->digits + 0x10,(long)iVar6 * 2 - 0x20);
      if (iVar7 < 0x14) {
        uStack_60 = 0x15cc2f;
        memset(auStack_64 + (long)iVar7 * 2,0,(ulong)(0x14 - iVar7) * 2);
      }
      local_50.digits[8] = local_50.digits[4];
      local_50.digits[9] = local_50.digits[5];
      local_50.digits[10] = local_50.digits[6];
      local_50.digits[0xb] = local_50.digits[7];
      local_50.len = 0xc;
      lVar8 = 0xd;
      do {
        if (local_50.digits[lVar8 + -2] != 0) break;
        local_50.len = (int)lVar8 + -2;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 1);
      uStack_60 = 0x15cc6e;
      add<13,13>(this,&this->super_gfint,&local_50);
      iVar7 = result->len;
      if (0x14 < (long)iVar7) {
        lVar8 = (long)iVar7 + -0x14;
        iVar12 = (int)lVar8;
        iVar6 = 4;
        if (iVar12 < 4) {
          iVar6 = iVar12;
        }
        uStack_60 = 0x15cca2;
        memcpy(__dest,result->digits + 0x14,(long)iVar6 * 2);
        if (iVar7 < 0x18) {
          uStack_60 = 0x15ccbe;
          memset(__dest + lVar8,0,(ulong)(0x18 - iVar7) * 2);
        }
        local_50.digits[4] = local_50.digits[0];
        local_50.digits[5] = local_50.digits[1];
        local_50.digits[6] = local_50.digits[2];
        local_50.digits[7] = local_50.digits[3];
        local_50.digits[8] = local_50.digits[0];
        local_50.digits[9] = local_50.digits[1];
        local_50.digits[10] = local_50.digits[2];
        local_50.digits[0xb] = local_50.digits[3];
        local_50.len = 0xc;
        lVar8 = 0xd;
        do {
          if (local_50.digits[lVar8 + -2] != 0) break;
          local_50.len = (int)lVar8 + -2;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 1);
        uStack_60 = 0x15cd02;
        add<13,13>(this,&this->super_gfint,&local_50);
      }
    }
  }
  return;
}

Assistant:

void reduce(const bigint<RESULT_DIGITS> &result)
    {
#if GF_BITS==192
        len = min(result.len, GF_DIGITS);
        memcpy(digits, result.digits, len*sizeof(digit));
        shrink();

        if(result.len > 192/BI_DIGIT_BITS)
        {
            gfield s;
            memcpy(s.digits, &result.digits[192/BI_DIGIT_BITS], min(result.len-192/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
            if(result.len < 256/BI_DIGIT_BITS) memset(&s.digits[result.len-192/BI_DIGIT_BITS], 0, (256/BI_DIGIT_BITS-result.len)*sizeof(digit));
            memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
            s.len = 128/BI_DIGIT_BITS;
            s.shrink();
            add(s);

            if(result.len > 256/BI_DIGIT_BITS)
            {
                memset(s.digits, 0, 64/BI_DIGIT_BITS*sizeof(digit));
                memcpy(&s.digits[64/BI_DIGIT_BITS], &result.digits[256/BI_DIGIT_BITS], min(result.len-256/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                if(result.len < 320/BI_DIGIT_BITS) memset(&s.digits[result.len+(64-256)/BI_DIGIT_BITS], 0, (320/BI_DIGIT_BITS-result.len)*sizeof(digit));
                memcpy(&s.digits[128/BI_DIGIT_BITS], &s.digits[64/BI_DIGIT_BITS], 64/BI_DIGIT_BITS*sizeof(digit));
                s.len = GF_DIGITS;
                s.shrink();
                add(s);

                if(result.len > 320/BI_DIGIT_BITS)
                {
                    memcpy(s.digits, &result.digits[320/BI_DIGIT_BITS], min(result.len-320/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                    if(result.len < 384/BI_DIGIT_BITS) memset(&s.digits[result.len-320/BI_DIGIT_BITS], 0, (384/BI_DIGIT_BITS-result.len)*sizeof(digit));
                    memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    memcpy(&s.digits[128/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    s.len = GF_DIGITS;
                    s.shrink();
                    add(s);
                }
            }
        }
        else if(*this >= P) gfint::sub(*this, P);
#else
#error Unsupported GF
#endif
    }